

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_4> * __thiscall
tcu::refract<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *i,
          Vector<double,_4> *n,double eta)

{
  double dVar1;
  int i_1;
  long lVar2;
  Vector<double,_4> *res_3;
  double dVar3;
  double res;
  double dVar4;
  Vector<double,_4> res_2;
  Vector<double,_4> res_1;
  double local_58 [9];
  
  dVar4 = 0.0;
  lVar2 = 0;
  do {
    dVar4 = dVar4 + i->m_data[lVar2] * *(double *)(this + lVar2 * 8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  dVar3 = 1.0 - eta * eta * (1.0 - dVar4 * dVar4);
  if (0.0 <= dVar3) {
    local_58[6] = 0.0;
    local_58[7] = 0.0;
    local_58[4] = 0.0;
    local_58[5] = 0.0;
    lVar2 = 0;
    do {
      dVar1 = *(double *)(this + lVar2 * 8 + 8);
      local_58[lVar2 + 4] = *(double *)(this + lVar2 * 8) * eta;
      local_58[lVar2 + 5] = dVar1 * eta;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    if (dVar3 < 0.0) {
      dVar3 = ::sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    local_58[2] = 0.0;
    local_58[3] = 0.0;
    local_58[0] = 0.0;
    local_58[1] = 0.0;
    dVar3 = eta * dVar4 + dVar3;
    lVar2 = 0;
    do {
      dVar4 = (i->m_data + lVar2)[1];
      local_58[lVar2] = i->m_data[lVar2] * dVar3;
      local_58[lVar2 + 1] = dVar4 * dVar3;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    lVar2 = 0;
    do {
      dVar4 = local_58[lVar2 + 5];
      dVar3 = local_58[lVar2 + 1];
      __return_storage_ptr__->m_data[lVar2] = local_58[lVar2 + 4] - local_58[lVar2];
      (__return_storage_ptr__->m_data + lVar2)[1] = dVar4 - dVar3;
      lVar2 = lVar2 + 2;
    } while (lVar2 != 4);
  }
  else {
    __return_storage_ptr__->m_data[2] = 0.0;
    __return_storage_ptr__->m_data[3] = 0.0;
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}